

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O1

ProjectionLight *
pbrt::ProjectionLight::Create
          (Transform *renderFromLight,MediumHandle *medium,ParameterDictionary *parameters,
          FileLoc *loc,Allocator alloc)

{
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pIVar1;
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pIVar2;
  Float (*paFVar3) [4];
  int iVar4;
  undefined4 extraout_var;
  long lVar5;
  _Alloc_hider _Var6;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  Allocator alloc_local;
  Float fov;
  Float power;
  Float scale;
  RGBColorSpace *colorSpace;
  string texname;
  ImageChannelDesc channelDesc;
  ColorEncodingHandle local_468;
  Image image;
  ImageAndMetadata imageAndMetadata;
  Transform flip;
  Transform renderFromLightFlipY;
  
  pIVar1 = &imageAndMetadata.image.channelNames;
  alloc_local = alloc;
  imageAndMetadata.image._0_8_ = pIVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&imageAndMetadata,"scale","");
  scale = ParameterDictionary::GetOneFloat(parameters,(string *)&imageAndMetadata,1.0);
  if ((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)imageAndMetadata.image._0_8_ != pIVar1) {
    operator_delete((void *)imageAndMetadata.image._0_8_,
                    (ulong)((long)&(imageAndMetadata.image.channelNames.alloc.memoryResource)->
                                   _vptr_memory_resource + 1));
  }
  imageAndMetadata.image._0_8_ = pIVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&imageAndMetadata,"power","");
  power = ParameterDictionary::GetOneFloat(parameters,(string *)&imageAndMetadata,-1.0);
  if ((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)imageAndMetadata.image._0_8_ != pIVar1) {
    operator_delete((void *)imageAndMetadata.image._0_8_,
                    (ulong)((long)&(imageAndMetadata.image.channelNames.alloc.memoryResource)->
                                   _vptr_memory_resource + 1));
  }
  imageAndMetadata.image._0_8_ = pIVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&imageAndMetadata,"fov","");
  fov = ParameterDictionary::GetOneFloat(parameters,(string *)&imageAndMetadata,90.0);
  if ((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)imageAndMetadata.image._0_8_ != pIVar1) {
    operator_delete((void *)imageAndMetadata.image._0_8_,
                    (ulong)((long)&(imageAndMetadata.image.channelNames.alloc.memoryResource)->
                                   _vptr_memory_resource + 1));
  }
  pIVar2 = &image.channelNames;
  image._0_8_ = pIVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&image,"filename","");
  paFVar3 = flip.m.m + 1;
  flip.m.m[0]._0_8_ = paFVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&flip,"");
  ParameterDictionary::GetOneString
            ((string *)&imageAndMetadata,parameters,(string *)&image,(string *)&flip);
  ResolveFilename(&texname,(string *)&imageAndMetadata);
  if ((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)imageAndMetadata.image._0_8_ != pIVar1) {
    operator_delete((void *)imageAndMetadata.image._0_8_,
                    (ulong)((long)&(imageAndMetadata.image.channelNames.alloc.memoryResource)->
                                   _vptr_memory_resource + 1));
  }
  if ((Float (*) [4])flip.m.m[0]._0_8_ != paFVar3) {
    operator_delete((void *)flip.m.m[0]._0_8_,flip.m.m[1]._0_8_ + 1);
  }
  if ((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)image._0_8_ != pIVar2) {
    operator_delete((void *)image._0_8_,
                    (ulong)((long)&(image.channelNames.alloc.memoryResource)->_vptr_memory_resource
                           + 1));
  }
  if (texname._M_string_length == 0) {
    ErrorExit(loc,"Must provide \"filename\" to \"projection\" light source");
  }
  local_468.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          )0;
  Image::Read(&imageAndMetadata,&texname,alloc_local,&local_468);
  colorSpace = ImageMetadata::GetColorSpace(&imageAndMetadata.metadata);
  image._0_8_ = pIVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&image,"R","");
  image.channelNames.field_2.fixed[0]._M_dataplus._M_p =
       (_Alloc_hider)((long)&image.channelNames.field_2 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&image.channelNames.field_2,"G","");
  _Var6._M_p = (pointer)((long)&image.channelNames.field_2 + 0x30);
  image.channelNames.field_2.fixed[1]._M_dataplus._M_p = (_Alloc_hider)_Var6._M_p;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&image.channelNames.field_2 + 0x20),"B","");
  requestedChannels.n = 3;
  requestedChannels.ptr =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&image;
  Image::GetChannelDesc(&channelDesc,&imageAndMetadata.image,requestedChannels);
  lVar5 = -0x60;
  do {
    if ((long *)_Var6._M_p != *(long **)((long)_Var6._M_p + -0x10)) {
      operator_delete(*(long **)((long)_Var6._M_p + -0x10),*(long *)_Var6._M_p + 1);
    }
    _Var6._M_p = _Var6._M_p + -0x20;
    lVar5 = lVar5 + 0x20;
  } while (lVar5 != 0);
  if (channelDesc.offset.nStored != 0) {
    Image::SelectChannels(&image,&imageAndMetadata.image,&channelDesc,alloc_local);
    Scale(&flip,1.0,-1.0,1.0);
    Transform::operator*(&renderFromLightFlipY,renderFromLight,&flip);
    iVar4 = (*(alloc_local.memoryResource)->_vptr_memory_resource[2])
                      (alloc_local.memoryResource,0x358,8);
    pstd::pmr::polymorphic_allocator<std::byte>::
    construct<pbrt::ProjectionLight,pbrt::Transform&,pbrt::MediumHandle&,pbrt::Image,pbrt::RGBColorSpace_const*&,float&,float&,float&,pstd::pmr::polymorphic_allocator<std::byte>&>
              (&alloc_local,(ProjectionLight *)CONCAT44(extraout_var,iVar4),&renderFromLightFlipY,
               medium,&image,&colorSpace,&scale,&fov,&power,&alloc_local);
    image.p32.nStored = 0;
    (*(image.p32.alloc.memoryResource)->_vptr_memory_resource[3])
              (image.p32.alloc.memoryResource,image.p32.ptr,image.p32.nAlloc << 2,4);
    image.p16.nStored = 0;
    (*(image.p16.alloc.memoryResource)->_vptr_memory_resource[3])
              (image.p16.alloc.memoryResource,image.p16.ptr,image.p16.nAlloc * 2,2);
    image.p8.nStored = 0;
    (*(image.p8.alloc.memoryResource)->_vptr_memory_resource[3])
              (image.p8.alloc.memoryResource,image.p8.ptr,image.p8.nAlloc,1);
    InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~InlinedVector(&image.channelNames);
    channelDesc.offset.nStored = 0;
    (*(channelDesc.offset.alloc.memoryResource)->_vptr_memory_resource[3])
              (channelDesc.offset.alloc.memoryResource,channelDesc.offset.ptr,
               channelDesc.offset.nAlloc << 2,4);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~_Rb_tree(&imageAndMetadata.metadata.stringVectors._M_t);
    if (imageAndMetadata.metadata.colorSpace.set == true) {
      imageAndMetadata.metadata.colorSpace.set = false;
    }
    if (imageAndMetadata.metadata.MSE.set == true) {
      imageAndMetadata.metadata.MSE.set = false;
    }
    if (imageAndMetadata.metadata.samplesPerPixel.set == true) {
      imageAndMetadata.metadata.samplesPerPixel.set = false;
    }
    if (imageAndMetadata.metadata.fullResolution.set == true) {
      imageAndMetadata.metadata.fullResolution.set = false;
    }
    if (imageAndMetadata.metadata.pixelBounds.set == true) {
      imageAndMetadata.metadata.pixelBounds.set = false;
    }
    if (imageAndMetadata.metadata.NDCFromWorld.set == true) {
      imageAndMetadata.metadata.NDCFromWorld.set = false;
    }
    if (imageAndMetadata.metadata.cameraFromWorld.set == true) {
      imageAndMetadata.metadata.cameraFromWorld.set = false;
    }
    if (imageAndMetadata.metadata.renderTimeSeconds.set == true) {
      imageAndMetadata.metadata.renderTimeSeconds.set = false;
    }
    imageAndMetadata.image.p32.nStored = 0;
    (*(imageAndMetadata.image.p32.alloc.memoryResource)->_vptr_memory_resource[3])
              (imageAndMetadata.image.p32.alloc.memoryResource,imageAndMetadata.image.p32.ptr,
               imageAndMetadata.image.p32.nAlloc << 2,4);
    imageAndMetadata.image.p16.nStored = 0;
    (*(imageAndMetadata.image.p16.alloc.memoryResource)->_vptr_memory_resource[3])
              (imageAndMetadata.image.p16.alloc.memoryResource,imageAndMetadata.image.p16.ptr,
               imageAndMetadata.image.p16.nAlloc * 2,2);
    imageAndMetadata.image.p8.nStored = 0;
    (*(imageAndMetadata.image.p8.alloc.memoryResource)->_vptr_memory_resource[3])
              (imageAndMetadata.image.p8.alloc.memoryResource,imageAndMetadata.image.p8.ptr,
               imageAndMetadata.image.p8.nAlloc,1);
    InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~InlinedVector(&imageAndMetadata.image.channelNames);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)texname._M_dataplus._M_p != &texname.field_2) {
      operator_delete(texname._M_dataplus._M_p,texname.field_2._M_allocated_capacity + 1);
    }
    return (ProjectionLight *)CONCAT44(extraout_var,iVar4);
  }
  ErrorExit(loc,"Image provided to \"projection\" light must have R, G, and B channels.");
}

Assistant:

ProjectionLight *ProjectionLight::Create(const Transform &renderFromLight,
                                         MediumHandle medium,
                                         const ParameterDictionary &parameters,
                                         const FileLoc *loc, Allocator alloc) {
    Float scale = parameters.GetOneFloat("scale", 1);
    Float power = parameters.GetOneFloat("power", -1);
    Float fov = parameters.GetOneFloat("fov", 90.);

    std::string texname = ResolveFilename(parameters.GetOneString("filename", ""));
    if (texname.empty())
        ErrorExit(loc, "Must provide \"filename\" to \"projection\" light source");

    ImageAndMetadata imageAndMetadata = Image::Read(texname, alloc);
    const RGBColorSpace *colorSpace = imageAndMetadata.metadata.GetColorSpace();

    ImageChannelDesc channelDesc = imageAndMetadata.image.GetChannelDesc({"R", "G", "B"});
    if (!channelDesc)
        ErrorExit(loc, "Image provided to \"projection\" light must have R, G, "
                       "and B channels.");
    Image image = imageAndMetadata.image.SelectChannels(channelDesc, alloc);

    Transform flip = Scale(1, -1, 1);
    Transform renderFromLightFlipY = renderFromLight * flip;

    return alloc.new_object<ProjectionLight>(renderFromLightFlipY, medium,
                                             std::move(image), colorSpace, scale, fov,
                                             power, alloc);
}